

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

int32_t ucol_getSortKey_63(UCollator *coll,UChar *source,int32_t sourceLength,uint8_t *result,
                          int32_t resultLength)

{
  int iVar1;
  Collator *pCVar2;
  int32_t keySize;
  int32_t resultLength_local;
  uint8_t *result_local;
  int32_t sourceLength_local;
  UChar *source_local;
  UCollator *coll_local;
  
  pCVar2 = icu_63::Collator::fromUCollator(coll);
  iVar1 = (*(pCVar2->super_UObject)._vptr_UObject[0x22])
                    (pCVar2,source,(ulong)(uint)sourceLength,result,(ulong)(uint)resultLength);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getSortKey(const    UCollator    *coll,
        const    UChar        *source,
        int32_t        sourceLength,
        uint8_t        *result,
        int32_t        resultLength)
{
    UTRACE_ENTRY(UTRACE_UCOL_GET_SORTKEY);
    if (UTRACE_LEVEL(UTRACE_VERBOSE)) {
        UTRACE_DATA3(UTRACE_VERBOSE, "coll=%p, source string = %vh ", coll, source,
            ((sourceLength==-1 && source!=NULL) ? u_strlen(source) : sourceLength));
    }

    int32_t keySize = Collator::fromUCollator(coll)->
            getSortKey(source, sourceLength, result, resultLength);

    UTRACE_DATA2(UTRACE_VERBOSE, "Sort Key = %vb", result, keySize);
    UTRACE_EXIT_VALUE(keySize);
    return keySize;
}